

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.c
# Opt level: O3

int ecs_parse_signature_action
              (ecs_world_t *world,char *name,char *expr,int64_t column,ecs_sig_from_kind_t from_kind
              ,ecs_sig_oper_kind_t oper_kind,ecs_sig_inout_kind_t inout_kind,ecs_entity_t role,
              char *entity_id,char *source_id,char *trait_id,char *arg_name,void *data)

{
  char cVar1;
  ecs_entity_t eVar2;
  ecs_entity_t eVar3;
  ecs_entity_t source;
  char *fmt;
  
  _ecs_assert(data != (void *)0x0,0xc,(char *)0x0,"sig != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/signature.c"
              ,0x235);
  if (data == (void *)0x0) {
    __assert_fail("sig != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/signature.c"
                  ,0x235,
                  "int ecs_parse_signature_action(ecs_world_t *, const char *, const char *, int64_t, ecs_sig_from_kind_t, ecs_sig_oper_kind_t, ecs_sig_inout_kind_t, ecs_entity_t, const char *, const char *, const char *, const char *, void *)"
                 );
  }
  cVar1 = *entity_id;
  if (cVar1 == '$') {
    if (from_kind == EcsFromEntity) {
      fmt = "singleton component \'%s\' cannot have a source";
      goto LAB_0011e40a;
    }
    entity_id = entity_id + 1;
    from_kind = EcsFromEntity;
  }
  eVar2 = ecs_lookup_path_w_sep(world,0,entity_id,".",(char *)0x0);
  if (eVar2 == 0) {
    if ((*entity_id == '0') && (entity_id[1] == '\0')) {
      return 0;
    }
    fmt = "unresolved component identifier \'%s\'";
  }
  else {
    source = 0;
    if (cVar1 == '$') {
      source = eVar2;
    }
    if (trait_id != (char *)0x0) {
      eVar3 = ecs_lookup_path_w_sep(world,0,trait_id,".",(char *)0x0);
      if (eVar3 == 0) {
        fmt = "unresolved trait identifier \'%s\'";
        entity_id = trait_id;
        goto LAB_0011e40a;
      }
      eVar2 = eVar2 & 0xffffffff | eVar3 << 0x20;
    }
    if ((from_kind != EcsFromEntity || source != 0) ||
       (source = ecs_lookup_path_w_sep(world,0,source_id,".",(char *)0x0), source != 0)) {
      ecs_sig_add(world,(ecs_sig_t *)data,from_kind,oper_kind,inout_kind,eVar2 | role,source,
                  arg_name);
      return 0;
    }
    fmt = "unresolved source identifier \'%s\'";
    entity_id = source_id;
  }
LAB_0011e40a:
  _ecs_parser_error(name,expr,column,fmt,entity_id);
  abort();
}

Assistant:

static
int ecs_parse_signature_action(
    ecs_world_t *world,
    const char *name,
    const char *expr,
    int64_t column,
    ecs_sig_from_kind_t from_kind,
    ecs_sig_oper_kind_t oper_kind,
    ecs_sig_inout_kind_t inout_kind,
    ecs_entity_t role,
    const char *entity_id,
    const char *source_id,
    const char *trait_id,
    const char *arg_name,
    void *data)
{
    ecs_sig_t *sig = data;
    bool is_singleton = false;

    ecs_assert(sig != NULL, ECS_INTERNAL_ERROR, NULL);

    if (entity_id[0] == '$') {
        if (from_kind ==  EcsFromEntity) {
            ecs_parser_error(name, expr, column, 
                "singleton component '%s' cannot have a source", entity_id);
        }

        from_kind = EcsFromEntity;
        is_singleton = true;
        entity_id ++;
    }

    /* Lookup component handle by string identifier */
    ecs_entity_t source = 0, component = ecs_lookup_fullpath(world, entity_id);
    if (!component) {
        /* "0" is a valid expression used to indicate that a system matches no
         * components */
        if (!strcmp(entity_id, "0")) {
            /* No need to add 0 component to signature */
            return 0;
        } else {
            ecs_parser_error(name, expr, column, 
                "unresolved component identifier '%s'", entity_id);
        }
    }

    if (is_singleton) {
        source = component;
    }

    /* Lookup trait handle by string identifier */
    if (trait_id) {
        ecs_entity_t trait = ecs_lookup_fullpath(world, trait_id);
        if (!trait) {
            ecs_parser_error(name, expr, column, 
                "unresolved trait identifier '%s'", trait_id);
        } else {
            component = ecs_entity_t_comb(component, trait);
        }
    }

    component |= role;

    if (!source && from_kind == EcsFromEntity) {
        source = ecs_lookup_fullpath(world, source_id);
        if (!source) {
            ecs_parser_error(name, expr, column, 
                "unresolved source identifier '%s'", source_id);
        }
    }

    return ecs_sig_add(
        world, sig, from_kind, oper_kind, inout_kind, component, source, 
        arg_name);
}